

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

ON_wString __thiscall
ON_ModelComponent::ComponentTypeToString(ON_ModelComponent *this,Type component_type)

{
  Type component_type_local;
  
  switch(component_type) {
  case Unset:
    ON_wString::ON_wString((ON_wString *)this,"Unset");
    break;
  case Image:
    ON_wString::ON_wString((ON_wString *)this,"EmbeddedFile");
    break;
  case TextureMapping:
    ON_wString::ON_wString((ON_wString *)this,"TextureMapping");
    break;
  case Material:
    ON_wString::ON_wString((ON_wString *)this,"RenderMaterial");
    break;
  case LinePattern:
    ON_wString::ON_wString((ON_wString *)this,"LinePattern");
    break;
  case Layer:
    ON_wString::ON_wString((ON_wString *)this,"Layer");
    break;
  case Group:
    ON_wString::ON_wString((ON_wString *)this,"Group");
    break;
  case TextStyle:
    ON_wString::ON_wString((ON_wString *)this,"TextStyle");
    break;
  case DimStyle:
    ON_wString::ON_wString((ON_wString *)this,"AnnotationStyle");
    break;
  case RenderLight:
    ON_wString::ON_wString((ON_wString *)this,"RenderLight");
    break;
  case HatchPattern:
    ON_wString::ON_wString((ON_wString *)this,"HatchPattern");
    break;
  case InstanceDefinition:
    ON_wString::ON_wString((ON_wString *)this,"InstanceDefinition");
    break;
  case ModelGeometry:
    ON_wString::ON_wString((ON_wString *)this,"ModelGeometry");
    break;
  case HistoryRecord:
    ON_wString::ON_wString((ON_wString *)this,"HistoryRecord");
    break;
  case RenderContent:
    ON_wString::ON_wString((ON_wString *)this,"RenderContent");
    break;
  case EmbeddedFile:
    ON_wString::ON_wString((ON_wString *)this,"EmbeddedFile");
    break;
  case ObsoleteValue:
    ON_wString::ON_wString((ON_wString *)this,"ObsoleteValue");
    break;
  case SectionStyle:
    ON_wString::ON_wString((ON_wString *)this,"SectionStyle");
    break;
  case Mixed:
    ON_wString::ON_wString((ON_wString *)this,"Mixed");
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x4f,"","invalid m_component_type value");
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::ComponentTypeToString(
  ON_ModelComponent::Type component_type
  )
{
  switch (component_type)
  {
  case ON_ModelComponent::Type::Unset:
    return ON_wString("Unset");
  case ON_ModelComponent::Type::ModelGeometry:
    return ON_wString("ModelGeometry");
  case ON_ModelComponent::Type::Image:
    return ON_wString("EmbeddedFile");
  case ON_ModelComponent::Type::LinePattern:
    return ON_wString("LinePattern");
  case ON_ModelComponent::Type::Layer:
    return ON_wString("Layer");
  case ON_ModelComponent::Type::Group:
    return ON_wString("Group");
  case ON_ModelComponent::Type::TextStyle:
    return ON_wString("TextStyle");
  case ON_ModelComponent::Type::DimStyle:
    return ON_wString("AnnotationStyle");
  case ON_ModelComponent::Type::HatchPattern:
    return ON_wString("HatchPattern");
  case ON_ModelComponent::Type::InstanceDefinition:
    return ON_wString("InstanceDefinition");
  case ON_ModelComponent::Type::HistoryRecord:
    return ON_wString("HistoryRecord");
  case ON_ModelComponent::Type::TextureMapping:
    return ON_wString("TextureMapping");
  case ON_ModelComponent::Type::Material:
    return ON_wString("RenderMaterial");
  case ON_ModelComponent::Type::RenderLight:
    return ON_wString("RenderLight");
  case ON_ModelComponent::Type::RenderContent:
    return ON_wString("RenderContent");
  case ON_ModelComponent::Type::EmbeddedFile:
    return ON_wString("EmbeddedFile");
  case ON_ModelComponent::Type::SectionStyle:
    return ON_wString("SectionStyle");
  case ON_ModelComponent::Type::ObsoleteValue:
    return ON_wString("ObsoleteValue");
  case ON_ModelComponent::Type::Mixed:
    return ON_wString("Mixed");
  default:
    ON_ERROR("invalid m_component_type value");
  }

  return ON_wString::EmptyString;
}